

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

ggml_backend_reg_t __thiscall
ggml_backend_registry::load_backend(ggml_backend_registry *this,path *path,bool silent)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte in_DL;
  dl_handle_ptr *in_RDI;
  ggml_backend_reg_t reg;
  ggml_backend_init_t backend_init_fn;
  ggml_backend_score_t score_fn;
  dl_handle_ptr handle;
  char *in_stack_fffffffffffffea8;
  unique_ptr<void,_dl_handle_deleter> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  _Head_base<0UL,_void_*,_false> in_stack_fffffffffffffee8;
  ggml_backend_registry *in_stack_fffffffffffffef0;
  string local_f0 [32];
  string local_d0 [32];
  ggml_backend_reg_t local_b0;
  string local_a8 [32];
  code *local_88;
  string local_80 [32];
  code *local_60;
  undefined4 local_58;
  string local_48 [47];
  byte local_19;
  ggml_backend_reg_t local_8;
  
  local_19 = in_DL & 1;
  dl_load_library((path *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  std::unique_ptr<void,dl_handle_deleter>::unique_ptr<dl_handle_deleter,void>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr<void,_dl_handle_deleter> *)0x113cb9);
  if (bVar1) {
    std::unique_ptr<void,_dl_handle_deleter>::get(in_stack_fffffffffffffeb0);
    local_60 = (code *)dl_get_sym(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if ((local_60 == (code *)0x0) || (iVar2 = (*local_60)(), iVar2 != 0)) {
      std::unique_ptr<void,_dl_handle_deleter>::get(in_stack_fffffffffffffeb0);
      local_88 = (code *)dl_get_sym(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (local_88 == (code *)0x0) {
        if ((local_19 & 1) == 0) {
          path_str((path *)in_stack_fffffffffffffee8._M_head_impl);
          uVar3 = std::__cxx11::string::c_str();
          ggml_log_internal(4,"%s: failed to find ggml_backend_init in %s\n","load_backend",uVar3);
          std::__cxx11::string::~string(local_a8);
        }
        local_8 = (ggml_backend_reg_t)0x0;
      }
      else {
        local_b0 = (ggml_backend_reg_t)(*local_88)();
        if ((local_b0 == (ggml_backend_reg_t)0x0) || (local_b0->api_version != 1)) {
          if ((local_19 & 1) == 0) {
            if (local_b0 == (ggml_backend_reg_t)0x0) {
              path_str((path *)in_stack_fffffffffffffee8._M_head_impl);
              uVar3 = std::__cxx11::string::c_str();
              ggml_log_internal(4,
                                "%s: failed to initialize backend from %s: ggml_backend_init returned NULL\n"
                                ,"load_backend",uVar3);
              std::__cxx11::string::~string(local_d0);
            }
            else {
              path_str((path *)in_stack_fffffffffffffee8._M_head_impl);
              uVar3 = std::__cxx11::string::c_str();
              ggml_log_internal(4,
                                "%s: failed to initialize backend from %s: incompatible API version (backend: %d, current: %d)\n"
                                ,"load_backend",uVar3,local_b0->api_version,1);
              std::__cxx11::string::~string(local_f0);
            }
          }
          local_8 = (ggml_backend_reg_t)0x0;
        }
        else {
          uVar3 = ggml_backend_reg_name(local_b0);
          path_str((path *)in_stack_fffffffffffffee8._M_head_impl);
          uVar4 = std::__cxx11::string::c_str();
          ggml_log_internal(2,"%s: loaded %s backend from %s\n","load_backend",uVar3,uVar4);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
          in_stack_fffffffffffffeb0 =
               (unique_ptr<void,_dl_handle_deleter> *)&stack0xfffffffffffffee8;
          std::unique_ptr<void,_dl_handle_deleter>::unique_ptr
                    (in_stack_fffffffffffffeb0,(unique_ptr<void,_dl_handle_deleter> *)local_b0);
          register_backend(in_stack_fffffffffffffef0,
                           (ggml_backend_reg_t)in_stack_fffffffffffffee8._M_head_impl,in_RDI);
          std::unique_ptr<void,_dl_handle_deleter>::~unique_ptr(in_stack_fffffffffffffeb0);
          local_8 = local_b0;
        }
      }
    }
    else {
      if ((local_19 & 1) == 0) {
        path_str((path *)in_stack_fffffffffffffee8._M_head_impl);
        uVar3 = std::__cxx11::string::c_str();
        ggml_log_internal(2,"%s: backend %s is not supported on this system\n","load_backend",uVar3)
        ;
        std::__cxx11::string::~string(local_80);
      }
      local_8 = (ggml_backend_reg_t)0x0;
    }
  }
  else {
    if ((local_19 & 1) == 0) {
      path_str((path *)in_stack_fffffffffffffee8._M_head_impl);
      uVar3 = std::__cxx11::string::c_str();
      ggml_log_internal(4,"%s: failed to load %s\n","load_backend",uVar3);
      std::__cxx11::string::~string(local_48);
    }
    local_8 = (ggml_backend_reg_t)0x0;
  }
  local_58 = 1;
  std::unique_ptr<void,_dl_handle_deleter>::~unique_ptr(in_stack_fffffffffffffeb0);
  return local_8;
}

Assistant:

ggml_backend_reg_t load_backend(const fs::path & path, bool silent) {
        dl_handle_ptr handle { dl_load_library(path) };
        if (!handle) {
            if (!silent) {
                GGML_LOG_ERROR("%s: failed to load %s\n", __func__, path_str(path).c_str());
            }
            return nullptr;
        }

        auto score_fn = (ggml_backend_score_t) dl_get_sym(handle.get(), "ggml_backend_score");
        if (score_fn && score_fn() == 0) {
            if (!silent) {
                GGML_LOG_INFO("%s: backend %s is not supported on this system\n", __func__, path_str(path).c_str());
            }
            return nullptr;
        }

        auto backend_init_fn = (ggml_backend_init_t) dl_get_sym(handle.get(), "ggml_backend_init");
        if (!backend_init_fn) {
            if (!silent) {
                GGML_LOG_ERROR("%s: failed to find ggml_backend_init in %s\n", __func__, path_str(path).c_str());
            }
            return nullptr;
        }

        ggml_backend_reg_t reg = backend_init_fn();
        if (!reg || reg->api_version != GGML_BACKEND_API_VERSION) {
            if (!silent) {
                if (!reg) {
                    GGML_LOG_ERROR("%s: failed to initialize backend from %s: ggml_backend_init returned NULL\n",
                        __func__, path_str(path).c_str());
                } else {
                    GGML_LOG_ERROR("%s: failed to initialize backend from %s: incompatible API version (backend: %d, current: %d)\n",
                        __func__, path_str(path).c_str(), reg->api_version, GGML_BACKEND_API_VERSION);
                }
            }
            return nullptr;
        }

        GGML_LOG_INFO("%s: loaded %s backend from %s\n", __func__, ggml_backend_reg_name(reg), path_str(path).c_str());

        register_backend(reg, std::move(handle));

        return reg;
    }